

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

size_t __thiscall efsw::String::find_first_not_of(String *this,StringBaseType c,size_t pos)

{
  size_type sVar1;
  size_t pos_local;
  StringBaseType c_local;
  String *this_local;
  
  sVar1 = std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
          find_first_not_of(&this->mString,c,pos);
  return sVar1;
}

Assistant:

std::size_t String::find_first_not_of( StringBaseType c, std::size_t pos ) const {
	return mString.find_first_not_of( c, pos );
}